

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O2

void * worker_thread_put_in_gets(void *arg)

{
  int iVar1;
  FILE *__stream;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  ulong local_30;
  
  iVar1 = *(int *)((long)arg + 0x1c);
  local_30 = (ulong)((*arg & 1) + iVar1);
  while( true ) {
    if ((uint)(iVar1 * 3) <= local_30) {
      return (void *)0x0;
    }
    lVar4 = (local_30 % (ulong)*(uint *)((long)arg + 0x18)) * 0x10;
    iVar2 = vmemcache_put(*(undefined8 *)((long)arg + 8),&local_30,8,
                          *(undefined8 *)(*(long *)((long)arg + 0x10) + 8 + lVar4),
                          *(undefined8 *)(*(long *)((long)arg + 0x10) + lVar4));
    if (iVar2 != 0) break;
    local_30 = local_30 + 2;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
          ,0xa3,"worker_thread_put_in_gets");
  __stream = _stderr;
  uVar3 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_put: %s",uVar3);
  fputc(10,_stderr);
  abort();
}

Assistant:

static void *
worker_thread_put_in_gets(void *arg)
{
	struct context *ctx = arg;
	unsigned long long i;
	unsigned long long start = ctx->ops_count + (ctx->thread_number & 0x1);

	/*
	 * There is '3' here - in order to have the same number (ctx->ops_count)
	 * of operations per each thread.
	 */
	unsigned long long end = 3 * ctx->ops_count;

	for (i = start; i < end; i += 2) {
		if (vmemcache_put(ctx->cache, &i, sizeof(i),
				ctx->buffs[i % ctx->nbuffs].buff,
				ctx->buffs[i % ctx->nbuffs].size))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
	}

	return NULL;
}